

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Rational * __thiscall Matrix<Rational>::det(Rational *__return_storage_ptr__,Matrix<Rational> *this)

{
  uint uVar1;
  matrix_error *this_00;
  uint uVar2;
  ulong uVar3;
  Matrix<Rational> tmp;
  Matrix<Rational> MStack_28;
  
  if (this->N != this->M) {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Trying to calculate determinant of a non-square matrix");
    __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Matrix(&MStack_28,this);
  uVar1 = gauss(&MStack_28,(Matrix<Rational> *)0x0);
  if (uVar1 == this->N) {
    BigInteger::BigInteger(&__return_storage_ptr__->_numerator,1);
    BigInteger::BigInteger(&__return_storage_ptr__->_denominator,1);
    if (this->N * this->N != 0) {
      uVar3 = 0;
      do {
        Rational::operator*=(__return_storage_ptr__,MStack_28.arr + uVar3);
        uVar1 = this->N;
        uVar2 = (int)uVar3 + uVar1 + 1;
        uVar3 = (ulong)uVar2;
      } while (uVar2 < uVar1 * uVar1);
    }
  }
  else {
    BigInteger::BigInteger(&__return_storage_ptr__->_numerator,0);
    BigInteger::BigInteger(&__return_storage_ptr__->_denominator,1);
  }
  ~Matrix(&MStack_28);
  return __return_storage_ptr__;
}

Assistant:

const Field Matrix<Field>::det() const
{
    if(N != M)
        throw matrix_error("Trying to calculate determinant of a non-square matrix");
    Matrix tmp(*this);
    if(tmp.gauss() != N)
        return Field();
    Field ans = 1;
    for(unsigned i = 0; i < N * N; i += N + 1)
    {
        ans *= tmp.arr[i];
    }
    return ans;
}